

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void build_mc_border(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int x,int y,int b_w,
                    int b_h,int w,int h)

{
  int iVar1;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int left;
  int copy;
  int right;
  uint8_t *ref_row;
  int in_stack_00000020;
  int local_40;
  int local_3c;
  int local_34;
  byte *local_30;
  int local_24;
  void *local_18;
  
  local_30 = (byte *)((in_RDI - in_R8D) - (long)(in_R9D * in_ESI));
  local_24 = in_R9D;
  local_18 = in_RDX;
  if (in_R9D < in_stack_00000020) {
    if (0 < in_R9D) {
      local_30 = local_30 + in_R9D * in_ESI;
    }
  }
  else {
    local_30 = local_30 + (in_stack_00000020 + -1) * in_ESI;
  }
  do {
    local_34 = 0;
    if (in_R8D < 0) {
      local_40 = -in_R8D;
    }
    else {
      local_40 = 0;
    }
    local_3c = local_40;
    if (in_stack_00000008 < local_40) {
      local_3c = in_stack_00000008;
    }
    if ((int)ref_row < in_R8D + in_stack_00000008) {
      local_34 = (in_R8D + in_stack_00000008) - (int)ref_row;
    }
    if (in_stack_00000008 < local_34) {
      local_34 = in_stack_00000008;
    }
    iVar1 = (in_stack_00000008 - local_3c) - local_34;
    if (local_3c != 0) {
      memset(local_18,(uint)*local_30,(long)local_3c);
    }
    if (iVar1 != 0) {
      memcpy((void *)((long)local_18 + (long)local_3c),local_30 + (long)local_3c + (long)in_R8D,
             (long)iVar1);
    }
    if (local_34 != 0) {
      memset((void *)((long)local_18 + (long)iVar1 + (long)local_3c),
             (uint)local_30[(int)ref_row + -1],(long)local_34);
    }
    local_18 = (void *)((long)local_18 + (long)in_ECX);
    local_24 = local_24 + 1;
    if ((0 < local_24) && (local_24 < in_stack_00000020)) {
      local_30 = local_30 + in_ESI;
    }
    copy = copy + -1;
  } while (copy != 0);
  return;
}

Assistant:

static inline void build_mc_border(const uint8_t *src, int src_stride,
                                   uint8_t *dst, int dst_stride, int x, int y,
                                   int b_w, int b_h, int w, int h) {
  // Get a pointer to the start of the real data for this row.
  const uint8_t *ref_row = src - x - y * src_stride;

  if (y >= h)
    ref_row += (h - 1) * src_stride;
  else if (y > 0)
    ref_row += y * src_stride;

  do {
    int right = 0, copy;
    int left = x < 0 ? -x : 0;

    if (left > b_w) left = b_w;

    if (x + b_w > w) right = x + b_w - w;

    if (right > b_w) right = b_w;

    copy = b_w - left - right;

    if (left) memset(dst, ref_row[0], left);

    if (copy) memcpy(dst + left, ref_row + x + left, copy);

    if (right) memset(dst + left + copy, ref_row[w - 1], right);

    dst += dst_stride;
    ++y;

    if (y > 0 && y < h) ref_row += src_stride;
  } while (--b_h);
}